

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<double,int,int(*)(char_const**,double*)>
               (int num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  byte bVar6;
  code *pcVar7;
  char (*pacVar8) [16];
  char (*pacVar9) [16];
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  float fVar10;
  uint extraout_EDX_01;
  char *pcVar11;
  ulong uVar12;
  double dVar13;
  uint uVar14;
  char *pcVar15;
  byte *pbVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char cVar20;
  ulong uVar21;
  undefined8 uVar22;
  long lVar23;
  undefined *puVar24;
  undefined1 *__maxlen;
  bool bVar25;
  double num2;
  char *mp_num_pos2;
  char mp_nums [16] [16];
  char str [256];
  double dStack_bb8;
  undefined1 *puStack_bb0;
  char acStack_ba8 [256];
  undefined1 uStack_aa8;
  undefined8 uStack_aa7;
  undefined1 auStack_a9f [255];
  char (*pacStack_9a0) [16];
  undefined8 uStack_998;
  undefined *puStack_990;
  code *pcStack_988;
  double dStack_980;
  byte *pbStack_978;
  char acStack_970 [256];
  byte abStack_870 [16];
  byte abStack_860 [248];
  long lStack_768;
  ulong uStack_760;
  char *pcStack_758;
  char *pcStack_750;
  char *pcStack_748;
  code *pcStack_740;
  char (*pacStack_738) [16];
  char *pcStack_730;
  float fStack_728;
  undefined4 uStack_724;
  double dStack_720;
  double dStack_718;
  char (*pacStack_710) [16];
  char acStack_708 [256];
  byte bStack_608;
  undefined8 uStack_607;
  char acStack_5ff [255];
  long lStack_500;
  ulong uStack_4f8;
  char *pcStack_4f0;
  char *pcStack_4e8;
  char *pcStack_4e0;
  code *pcStack_4d8;
  char (*pacStack_4d0) [16];
  char *pcStack_4c8;
  float fStack_4c0;
  undefined4 uStack_4bc;
  double dStack_4b8;
  double dStack_4b0;
  code *pcStack_4a8;
  byte bStack_4a0;
  undefined8 uStack_49f;
  char acStack_497 [247];
  char acStack_3a0 [256];
  undefined1 auStack_2a0 [8];
  char *pcStack_298;
  ulong uStack_290;
  char *pcStack_288;
  long lStack_280;
  undefined1 *puStack_278;
  code *pcStack_270;
  code *local_268;
  float local_25c;
  double local_258;
  double local_250;
  char *local_248;
  _func_int_char_ptr_ptr_double_ptr *local_240;
  byte local_238;
  undefined8 local_237;
  char acStack_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  builtin_strncpy(local_138,"typed read of ",0xf);
  local_268 = (code *)(long)num1;
  if (num1 < 0) {
    pcVar11 = "%lld";
    pcVar7 = local_268;
  }
  else {
    pcVar11 = "%llu";
    pcVar7 = (code *)(ulong)(uint)num1;
  }
  pcStack_270 = (code *)0x1386a4;
  local_240 = read_f;
  iVar2 = snprintf(local_138 + 0xe,0xf2,pcVar11,pcVar7);
  pcVar11 = local_138 + 0xe + iVar2;
  iVar3 = 0;
  pcStack_270 = (code *)0x1386c3;
  iVar2 = snprintf(pcVar11,(size_t)(local_38 + -(long)pcVar11)," into ");
  __maxlen = local_38 + -(long)(pcVar11 + iVar2);
  pcStack_270 = (code *)0x1386dd;
  snprintf(pcVar11 + iVar2,(size_t)__maxlen,"double");
  pcStack_270 = (code *)0x1386ec;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x138705;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x138715;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x138722;
  fputc(10,_stdout);
  if (-1 < num1) {
    pcStack_270 = (code *)0x138733;
    iVar3 = test_encode_uint_all_sizes((char (*) [16])&local_238,(uint64_t)(ulong)(uint)num1);
  }
  pcVar17 = (char *)(&local_238 + (long)iVar3 * 0x10);
  pcStack_270 = (code *)0x138751;
  pcVar11 = (char *)local_268;
  iVar2 = test_encode_int_all_sizes((char (*) [16])pcVar17,(int64_t)local_268);
  uVar14 = iVar3 + iVar2;
  if (uVar14 != 0 && SCARRY4(iVar3,iVar2) == (int)uVar14 < 0) {
    local_25c = (float)num1;
    local_258 = (double)num1;
    uVar21 = (ulong)uVar14;
    pcVar18 = (char *)((long)&local_237 + 1);
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    lVar23 = 0;
    do {
      lVar4 = lVar23 * 0x10;
      bVar6 = pcVar18[-2];
      pcVar7 = (code *)(ulong)bVar6;
      mVar1 = mp_type_hint[(long)pcVar7];
      pcVar19 = pcVar18;
      if (mVar1 == MP_UINT) {
        switch(bVar6) {
        case 0xcc:
          pcVar7 = (code *)(ulong)(byte)pcVar18[-1];
          break;
        case 0xcd:
          pcVar7 = (code *)(ulong)(ushort)(*(ushort *)(pcVar18 + -1) << 8 |
                                          *(ushort *)(pcVar18 + -1) >> 8);
          pcVar19 = acStack_22f + lVar4 + -6;
          break;
        case 0xce:
          uVar14 = *(uint *)(pcVar18 + -1);
          pcVar7 = (code *)(ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                   (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
          pcVar19 = acStack_22f + lVar4 + -4;
          break;
        case 0xcf:
          uVar12 = *(ulong *)(pcVar18 + -1);
          pcVar7 = (code *)(uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                            (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                            (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                            (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
          pcVar19 = acStack_22f + lVar23 * 0x10;
          break;
        default:
          if ((char)bVar6 < '\0') {
LAB_001389dc:
            pcStack_270 = (code *)0x1389e1;
            test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e1:
            pcStack_270 = (code *)0x1389e6;
            test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e6:
            pcStack_270 = (code *)0x138a05;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          pcVar19 = acStack_22f + (lVar23 * 2 + -1) * 8;
        }
        if (pcVar7 != local_268) {
          pcStack_270 = (code *)0x138a2e;
          test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_00138a2e:
          pcStack_270 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
          test_read_num<double,int,int(*)(char_const**,double*)>();
          pcStack_270 = (code *)0x1411a4;
          builtin_strncpy(acStack_3a0,"typed read of ",0xf);
          pcStack_4d8 = (code *)0x138a9a;
          uStack_4bc = extraout_EDX;
          pcStack_4a8 = (code *)pcVar11;
          pcStack_298 = pcVar19;
          uStack_290 = uVar21;
          pcStack_288 = pcVar18;
          lStack_280 = lVar23;
          puStack_278 = __maxlen;
          iVar2 = snprintf(acStack_3a0 + 0xe,0xf2,"%llu",pcVar17);
          pcVar11 = acStack_3a0 + (long)iVar2 + 0xe;
          pcStack_4d8 = (code *)0x138abe;
          iVar2 = snprintf(pcVar11,(size_t)(auStack_2a0 + -(long)pcVar11)," into ");
          pcStack_4d8 = (code *)0x138ad8;
          snprintf(pcVar11 + iVar2,(size_t)(auStack_2a0 + -(long)(pcVar11 + iVar2)),"double");
          pcStack_4d8 = (code *)0x138ae7;
          _space((FILE *)_stdout);
          pcStack_4d8 = (code *)0x138b00;
          fwrite("# ",2,1,_stdout);
          pcStack_4d8 = (code *)0x138b10;
          fputs(acStack_3a0,_stdout);
          pcStack_4d8 = (code *)0x138b1d;
          fputc(10,_stdout);
          pcStack_4d8 = (code *)0x138b2a;
          iVar2 = test_encode_uint_all_sizes((char (*) [16])&bStack_4a0,(uint64_t)pcVar17);
          pacVar9 = (char (*) [16])(&bStack_4a0 + (long)iVar2 * 0x10);
          pcStack_4d8 = (code *)0x138b48;
          pacStack_4d0 = (char (*) [16])pcVar17;
          iVar3 = test_encode_int_all_sizes(pacVar9,(int64_t)pcVar17);
          uVar14 = iVar2 + iVar3;
          if (uVar14 == 0 || SCARRY4(iVar2,iVar3) != (int)uVar14 < 0) {
            return;
          }
          fStack_4c0 = (float)(long)pacStack_4d0;
          dStack_4b8 = (double)(long)pacStack_4d0;
          uVar21 = (ulong)uVar14;
          pcVar18 = (char *)((long)&uStack_49f + 1);
          lVar23 = 0;
          goto LAB_00138b77;
        }
      }
      else if (mVar1 == MP_FLOAT) {
        if (bVar6 != 0xca) {
LAB_00138a0a:
          pcStack_270 = (code *)0x138a29;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        uVar14 = *(uint *)(pcVar18 + -1);
        fVar10 = (float)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                        uVar14 << 0x18);
        if ((fVar10 != local_25c) || (NAN(fVar10) || NAN(local_25c))) goto LAB_001389e1;
        pcVar19 = pcVar18 + 3;
      }
      else if (mVar1 == MP_INT) {
        pcVar7 = (code *)(long)(char)bVar6;
        switch(bVar6) {
        case 0xd0:
          pcVar7 = (code *)(long)pcVar18[-1];
          pcVar11 = (char *)&switchD_001387d7::switchdataD_00140dfc;
          break;
        case 0xd1:
          pcVar7 = (code *)(long)(short)(*(ushort *)(pcVar18 + -1) << 8 |
                                        *(ushort *)(pcVar18 + -1) >> 8);
          pcVar19 = acStack_22f + lVar4 + -6;
          pcVar11 = (char *)&switchD_001387d7::switchdataD_00140dfc;
          break;
        case 0xd2:
          uVar14 = *(uint *)(pcVar18 + -1);
          pcVar7 = (code *)(long)(int)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                       (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
          pcVar19 = acStack_22f + lVar4 + -4;
          pcVar11 = (char *)&switchD_001387d7::switchdataD_00140dfc;
          break;
        case 0xd3:
          uVar12 = *(ulong *)(pcVar18 + -1);
          pcVar7 = (code *)(uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                            (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                            (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                            (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
          pcVar19 = acStack_22f + lVar23 * 0x10;
          pcVar11 = (char *)&switchD_001387d7::switchdataD_00140dfc;
          break;
        default:
          if (bVar6 < 0xe0) {
            pcStack_270 = (code *)0x1389dc;
            test_read_num<double,int,int(*)(char_const**,double*)>();
            goto LAB_001389dc;
          }
          pcVar19 = acStack_22f + (lVar23 * 2 + -1) * 8;
        }
        if (pcVar7 != local_268) goto LAB_00138a2e;
      }
      else {
        if (bVar6 != 0xcb) goto LAB_001389e6;
        uVar12 = *(ulong *)(pcVar18 + -1);
        dVar13 = (double)(uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                          (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                          (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                          (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
        if ((dVar13 != local_258) || (NAN(dVar13) || NAN(local_258))) {
          pcStack_270 = (code *)0x138a0a;
          test_read_num<double,int,int(*)(char_const**,double*)>();
          goto LAB_00138a0a;
        }
        pcVar19 = acStack_22f + lVar23 * 0x10;
      }
      local_248 = pcVar18 + -2;
      __maxlen = (undefined1 *)(ulong)(uint)(int)(char)bVar6;
      local_250 = 0.0;
      pcStack_270 = (code *)0x138922;
      iVar2 = (*local_240)(&local_248,&local_250);
      pcStack_270 = (code *)0x13894a;
      _ok((uint)(iVar2 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",__maxlen);
      pcStack_270 = (code *)0x138972;
      _ok((uint)(pcVar19 == local_248),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      bVar25 = ABS(local_258 - local_250) < 1e-15;
      pcVar17 = (char *)(ulong)bVar25;
      pcVar11 = "double_eq(num1, num2)";
      pcStack_270 = (code *)0x1389b5;
      _ok((uint)bVar25,"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      lVar23 = lVar23 + 1;
      pcVar18 = pcVar18 + 0x10;
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
  }
  return;
LAB_00138b77:
  lVar4 = lVar23 * 0x10;
  bVar6 = pcVar18[-2];
  pacVar8 = (char (*) [16])(ulong)bVar6;
  mVar1 = mp_type_hint[(long)pacVar8];
  pcVar19 = pcVar18;
  if (mVar1 == MP_UINT) {
    switch(bVar6) {
    case 0xcc:
      pacVar8 = (char (*) [16])(ulong)(byte)pcVar18[-1];
      break;
    case 0xcd:
      pacVar8 = (char (*) [16])
                (ulong)(ushort)(*(ushort *)(pcVar18 + -1) << 8 | *(ushort *)(pcVar18 + -1) >> 8);
      pcVar19 = acStack_497 + lVar4 + -6;
      break;
    case 0xce:
      uVar14 = *(uint *)(pcVar18 + -1);
      pacVar8 = (char (*) [16])
                (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                       uVar14 << 0x18);
      pcVar19 = acStack_497 + lVar4 + -4;
      break;
    case 0xcf:
      uVar12 = *(ulong *)(pcVar18 + -1);
      pacVar8 = (char (*) [16])
                (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                 (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                 (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                 (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
      pcVar19 = acStack_497 + lVar23 * 0x10;
      break;
    default:
      if ((char)bVar6 < '\0') {
LAB_00138e36:
        pcStack_4d8 = (code *)0x138e3b;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e3b:
        pcStack_4d8 = (code *)0x138e40;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e40:
        pcStack_4d8 = (code *)0x138e5f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar19 = acStack_497 + (lVar23 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_4d0) {
      pcStack_4d8 = (code *)0x138e88;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e88:
      pcStack_4d8 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_708,"typed read of ",0xf);
      pcStack_740 = (code *)0x138ef1;
      uStack_724 = extraout_EDX_00;
      pacStack_710 = (char (*) [16])pcVar17;
      lStack_500 = lVar23;
      uStack_4f8 = uVar21;
      pcStack_4f0 = pcVar11;
      pcStack_4e8 = pcVar19;
      pcStack_4e0 = pcVar18;
      pcStack_4d8 = (code *)pcVar15;
      iVar2 = snprintf(acStack_708 + 0xe,0xf2,"%lld",pacVar9);
      pcVar11 = acStack_708 + (long)iVar2 + 0xe;
      pcStack_740 = (code *)0x138f12;
      iVar2 = snprintf(pcVar11,(size_t)(&bStack_608 + -(long)pcVar11)," into ");
      pcStack_740 = (code *)0x138f2c;
      snprintf(pcVar11 + iVar2,(size_t)(&bStack_608 + -(long)(pcVar11 + iVar2)),"double");
      pcStack_740 = (code *)0x138f3b;
      _space((FILE *)_stdout);
      pcStack_740 = (code *)0x138f54;
      fwrite("# ",2,1,_stdout);
      pcStack_740 = (code *)0x138f61;
      fputs(acStack_708,_stdout);
      pcStack_740 = (code *)0x138f6e;
      fputc(10,_stdout);
      pacVar8 = (char (*) [16])&bStack_608;
      pcStack_740 = (code *)0x138f82;
      pacStack_738 = pacVar9;
      uVar14 = test_encode_int_all_sizes(pacVar8,(int64_t)pacVar9);
      if ((int)uVar14 < 1) {
        return;
      }
      fStack_728 = (float)(long)pacStack_738;
      dStack_720 = (double)(long)pacStack_738;
      uVar21 = (ulong)uVar14;
      pcVar17 = (char *)((long)&uStack_607 + 1);
      lVar23 = 0;
      goto LAB_00138fb4;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar6 != 0xca) {
LAB_00138e64:
      pcStack_4d8 = (code *)0x138e83;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar14 = *(uint *)(pcVar18 + -1);
    fVar10 = (float)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18);
    if ((fVar10 != fStack_4c0) || (NAN(fVar10) || NAN(fStack_4c0))) goto LAB_00138e3b;
    pcVar19 = pcVar18 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar8 = (char (*) [16])(long)(char)bVar6;
    switch(bVar6) {
    case 0xd0:
      pacVar8 = (char (*) [16])(long)pcVar18[-1];
      pcVar17 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      break;
    case 0xd1:
      pacVar8 = (char (*) [16])
                (long)(short)(*(ushort *)(pcVar18 + -1) << 8 | *(ushort *)(pcVar18 + -1) >> 8);
      pcVar17 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar19 = acStack_497 + lVar4 + -6;
      break;
    case 0xd2:
      uVar14 = *(uint *)(pcVar18 + -1);
      pacVar8 = (char (*) [16])
                (long)(int)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                           uVar14 << 0x18);
      pcVar17 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar19 = acStack_497 + lVar4 + -4;
      break;
    case 0xd3:
      uVar12 = *(ulong *)(pcVar18 + -1);
      pacVar8 = (char (*) [16])
                (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                 (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                 (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                 (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
      pcVar17 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar19 = acStack_497 + lVar23 * 0x10;
      break;
    default:
      if (bVar6 < 0xe0) {
        pcStack_4d8 = (code *)0x138e36;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00138e36;
      }
      pcVar19 = acStack_497 + (lVar23 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_4d0) goto LAB_00138e88;
  }
  else {
    if (bVar6 != 0xcb) goto LAB_00138e40;
    uVar12 = *(ulong *)(pcVar18 + -1);
    dVar13 = (double)(uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                      (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                      (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                      (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
    if ((dVar13 != dStack_4b8) || (NAN(dVar13) || NAN(dStack_4b8))) {
      pcStack_4d8 = (code *)0x138e64;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00138e64;
    }
    pcVar19 = acStack_497 + lVar23 * 0x10;
  }
  pcVar15 = pcVar18 + -2;
  pcVar11 = (char *)(ulong)(uint)(int)(char)bVar6;
  dStack_4b0 = 0.0;
  pcStack_4d8 = (code *)0x138d17;
  pcStack_4c8 = pcVar15;
  iVar2 = (*pcStack_4a8)(&pcStack_4c8,&dStack_4b0);
  if ((char)uStack_4bc == '\0') {
    pcStack_4d8 = (code *)0x138de7;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar11);
    bVar25 = pcVar15 == pcStack_4c8;
    pcVar17 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar19 = "check position";
  }
  else {
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4d8 = (code *)0x138d51;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar11);
    pcStack_4d8 = (code *)0x138d79;
    _ok((uint)(pcVar19 == pcStack_4c8),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar25 = ABS(dStack_4b8 - dStack_4b0) < 1e-15;
    pcVar17 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar19 = "check float number";
  }
  pacVar9 = (char (*) [16])(ulong)bVar25;
  pcStack_4d8 = (code *)0x138e0f;
  _ok((uint)bVar25,pcVar17,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar19);
  lVar23 = lVar23 + 1;
  pcVar18 = pcVar18 + 0x10;
  uVar21 = uVar21 - 1;
  if (uVar21 == 0) {
    return;
  }
  goto LAB_00138b77;
LAB_00138fb4:
  lVar4 = lVar23 * 0x10;
  bVar6 = pcVar17[-2];
  pacVar9 = (char (*) [16])(ulong)bVar6;
  mVar1 = mp_type_hint[(long)pacVar9];
  pcVar18 = pcVar17;
  if (mVar1 == MP_UINT) {
    switch(bVar6) {
    case 0xcc:
      pacVar9 = (char (*) [16])(ulong)(byte)pcVar17[-1];
      break;
    case 0xcd:
      pacVar9 = (char (*) [16])
                (ulong)(ushort)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar18 = acStack_5ff + lVar4 + -6;
      break;
    case 0xce:
      uVar14 = *(uint *)(pcVar17 + -1);
      pacVar9 = (char (*) [16])
                (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                       uVar14 << 0x18);
      pcVar18 = acStack_5ff + lVar4 + -4;
      break;
    case 0xcf:
      uVar12 = *(ulong *)(pcVar17 + -1);
      pacVar9 = (char (*) [16])
                (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                 (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                 (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                 (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
      pcVar18 = acStack_5ff + lVar23 * 0x10;
      break;
    default:
      if ((char)bVar6 < '\0') {
LAB_00139276:
        pcStack_740 = (code *)0x13927b;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_0013927b:
        pcStack_740 = (code *)0x139280;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00139280:
        pcStack_740 = (code *)0x13929f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar18 = acStack_5ff + (lVar23 * 2 + -1) * 8;
    }
    if (pacVar9 != pacStack_738) {
      pcStack_740 = (code *)0x1392c8;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_001392c8:
      pcStack_740 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_970,"typed read of ",0xf);
      uVar22 = CONCAT71((int7)(uVar21 >> 8),1);
      pcStack_988 = (code *)0x13932e;
      lStack_768 = lVar23;
      uStack_760 = uVar21;
      pcStack_758 = pcVar11;
      pcStack_750 = pcVar18;
      pcStack_748 = pcVar17;
      pcStack_740 = (code *)pcVar15;
      iVar2 = snprintf(acStack_970 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar11 = acStack_970 + (long)iVar2 + 0xe;
      pcStack_988 = (code *)0x13934f;
      iVar2 = snprintf(pcVar11,(size_t)(abStack_870 + -(long)pcVar11)," into ");
      pcStack_988 = (code *)0x139369;
      snprintf(pcVar11 + iVar2,(size_t)(abStack_870 + -(long)(pcVar11 + iVar2)),"double");
      puVar24 = &stdout;
      pcStack_988 = (code *)0x139378;
      _space((FILE *)_stdout);
      pcStack_988 = (code *)0x139391;
      fwrite("# ",2,1,_stdout);
      pcStack_988 = (code *)0x13939e;
      fputs(acStack_970,_stdout);
      pcVar7 = (code *)0xa;
      pcStack_988 = (code *)0x1393ab;
      fputc(10,_stdout);
      abStack_870[0] = 0xca;
      abStack_870[1] = 0x4a;
      abStack_870[2] = 200;
      abStack_870[3] = 0x59;
      abStack_870[4] = 0x10;
      abStack_860[0] = 0xcb;
      abStack_860[1] = 0x41;
      abStack_860[2] = 0x59;
      abStack_860[3] = 0xb;
      abStack_860[4] = 0x22;
      abStack_860[5] = 0;
      abStack_860[6] = 0;
      abStack_860[7] = 0;
      abStack_860[8] = 0;
      pbVar5 = abStack_870;
      goto LAB_001393db;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar6 != 0xca) {
LAB_001392a4:
      pcStack_740 = (code *)0x1392c3;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar14 = *(uint *)(pcVar17 + -1);
    fVar10 = (float)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18);
    if ((fVar10 != fStack_728) || (NAN(fVar10) || NAN(fStack_728))) goto LAB_0013927b;
    pcVar18 = pcVar17 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar9 = (char (*) [16])(long)(char)bVar6;
    switch(bVar6) {
    case 0xd0:
      pacVar9 = (char (*) [16])(long)pcVar17[-1];
      break;
    case 0xd1:
      pacVar9 = (char (*) [16])
                (long)(short)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar18 = acStack_5ff + lVar4 + -6;
      break;
    case 0xd2:
      uVar14 = *(uint *)(pcVar17 + -1);
      pacVar9 = (char (*) [16])
                (long)(int)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                           uVar14 << 0x18);
      pcVar18 = acStack_5ff + lVar4 + -4;
      break;
    case 0xd3:
      uVar12 = *(ulong *)(pcVar17 + -1);
      pacVar9 = (char (*) [16])
                (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                 (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                 (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                 (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
      pcVar18 = acStack_5ff + lVar23 * 0x10;
      break;
    default:
      if (bVar6 < 0xe0) {
        pcStack_740 = (code *)0x139276;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00139276;
      }
      pcVar18 = acStack_5ff + (lVar23 * 2 + -1) * 8;
    }
    if (pacVar9 != pacStack_738) goto LAB_001392c8;
  }
  else {
    if (bVar6 != 0xcb) goto LAB_00139280;
    uVar12 = *(ulong *)(pcVar17 + -1);
    dVar13 = (double)(uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                      (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                      (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                      (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
    if ((dVar13 != dStack_720) || (NAN(dVar13) || NAN(dStack_720))) {
      pcStack_740 = (code *)0x1392a4;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_001392a4;
    }
    pcVar18 = acStack_5ff + lVar23 * 0x10;
  }
  pcVar15 = pcVar17 + -2;
  pcVar11 = (char *)(ulong)(uint)(int)(char)bVar6;
  dStack_718 = 0.0;
  pcStack_740 = (code *)0x139157;
  pcStack_730 = pcVar15;
  iVar2 = (*(code *)pacStack_710)(&pcStack_730,&dStack_718);
  if ((char)uStack_724 == '\0') {
    pcStack_740 = (code *)0x139227;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar11);
    bVar25 = pcVar15 == pcStack_730;
    pcVar18 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    pcVar19 = "check position";
  }
  else {
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_740 = (code *)0x139191;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar11);
    pcStack_740 = (code *)0x1391b9;
    _ok((uint)(pcVar18 == pcStack_730),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar25 = ABS(dStack_720 - dStack_718) < 1e-15;
    pcVar18 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    pcVar19 = "check float number";
  }
  pacVar8 = (char (*) [16])(ulong)bVar25;
  pcStack_740 = (code *)0x13924f;
  _ok((uint)bVar25,pcVar18,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      pcVar19);
  lVar23 = lVar23 + 1;
  pcVar17 = pcVar17 + 0x10;
  uVar21 = uVar21 - 1;
  if (uVar21 == 0) {
    return;
  }
  goto LAB_00138fb4;
LAB_001393db:
  bVar6 = *pbVar5;
  uVar21 = (ulong)bVar6;
  mVar1 = mp_type_hint[uVar21];
  if (mVar1 == MP_UINT) {
    if (bVar6 == 0xce) {
      uVar14 = *(uint *)(pbVar5 + 1);
      uVar12 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                      uVar14 << 0x18);
      pbVar16 = pbVar5 + 5;
LAB_001394a6:
      if (uVar12 == 0x642c88) goto LAB_001394cd;
    }
    else {
      if (bVar6 == 0xcf) {
        uVar12 = *(ulong *)(pbVar5 + 1);
        uVar12 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                 (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                 (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                 (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
        pbVar16 = pbVar5 + 9;
        goto LAB_001394a6;
      }
      if ((1 < bVar6 - 0xcc) && ((char)bVar6 < '\0')) {
        pcStack_988 = (code *)0x139617;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00139617;
      }
    }
    pcStack_988 = (code *)0x1395b5;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    bVar6 = (byte)uVar21;
    uVar14 = extraout_EDX_01;
LAB_001395b5:
    if ((1 < uVar14 - 0xd0) && (bVar6 < 0xe0)) {
LAB_00139617:
      pcStack_988 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_ba8,"typed read of ",0xf);
      pacStack_9a0 = pacVar8;
      uStack_998 = uVar22;
      puStack_990 = puVar24;
      pcStack_988 = (code *)abStack_860;
      iVar2 = snprintf(acStack_ba8 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar11 = acStack_ba8 + (long)iVar2 + 0xe;
      iVar2 = snprintf(pcVar11,(size_t)(&uStack_aa8 + -(long)pcVar11)," into ");
      snprintf(pcVar11 + iVar2,(size_t)(&uStack_aa8 + -(long)(pcVar11 + iVar2)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_ba8,_stdout);
      fputc(10,_stdout);
      puStack_bb0 = &uStack_aa8;
      uStack_aa8 = 0xcb;
      uStack_aa7 = 0xb81e85eb513816c0;
      dStack_bb8 = 0.0;
      iVar2 = (*pcVar7)(&puStack_bb0,&dStack_bb8);
      _ok((uint)(iVar2 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_a9f == puStack_bb0),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_bb8) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
LAB_001395c5:
    pcStack_988 = (code *)0x1395ca;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
    pcStack_988 = (code *)0x1395cf;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
    pcStack_988 = (code *)0x1395ee;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
  if (mVar1 == MP_FLOAT) {
    if (bVar6 != 0xca) {
LAB_001395f3:
      pcStack_988 = (code *)0x139612;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar14 = *(uint *)(pbVar5 + 1);
    fVar10 = (float)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18);
    if ((fVar10 == 6.565e+06) && (!NAN(fVar10))) {
      pbVar16 = pbVar5 + 5;
      goto LAB_001394cd;
    }
    goto LAB_001395ca;
  }
  if (mVar1 == MP_INT) {
    if (bVar6 != 0xd2) {
      uVar14 = (uint)bVar6;
      if (bVar6 == 0xd3) {
        uVar21 = *(ulong *)(pbVar5 + 1);
        uVar21 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                 (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                 (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                 (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
        pbVar16 = pbVar5 + 9;
        goto LAB_001394c0;
      }
      goto LAB_001395b5;
    }
    uVar14 = *(uint *)(pbVar5 + 1);
    pbVar16 = pbVar5 + 5;
    uVar21 = (ulong)(int)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                         uVar14 << 0x18);
LAB_001394c0:
    if (uVar21 == 0x642c88) goto LAB_001394cd;
    goto LAB_001395c5;
  }
  if (bVar6 != 0xcb) goto LAB_001395cf;
  uVar21 = *(ulong *)(pbVar5 + 1);
  dVar13 = (double)(uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                    (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                    (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                    (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38);
  if ((dVar13 != 6565000.0) || (NAN(dVar13))) {
    pcStack_988 = (code *)0x1395f3;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    goto LAB_001395f3;
  }
  pbVar16 = pbVar5 + 9;
LAB_001394cd:
  puVar24 = (undefined *)(ulong)(uint)(int)(char)bVar6;
  dStack_980 = 0.0;
  pcStack_988 = (code *)0x1394e8;
  pbStack_978 = pbVar5;
  iVar2 = (*(code *)pacVar8)(&pbStack_978,&dStack_980);
  pcStack_988 = (code *)0x139510;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar24);
  pcStack_988 = (code *)0x139538;
  _ok((uint)(pbVar16 == pbStack_978),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar25 = ABS(6565000.0 - dStack_980) < 1e-15;
  pcVar7 = (code *)(ulong)bVar25;
  pcStack_988 = (code *)0x13957c;
  _ok((uint)bVar25,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  cVar20 = (char)uVar22;
  uVar22 = 0;
  pbVar5 = abStack_860;
  if (cVar20 == '\0') {
    return;
  }
  goto LAB_001393db;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}